

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Vfs_chroot(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  jx9_value *pObj;
  anon_union_8_3_18420de5_for_x aVar4;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) {
    pvVar1 = pCtx->pFunc->pUserData;
    if ((pvVar1 != (void *)0x0) && (*(long *)((long)pvVar1 + 0x18) != 0)) {
      pcVar3 = jx9_value_to_string(*apArg,(int *)0x0);
      iVar2 = (**(code **)((long)pvVar1 + 0x18))(pcVar3);
      aVar4.iVal._1_7_ = 0;
      aVar4.iVal._0_1_ = iVar2 == 0;
      pObj = pCtx->pRet;
      jx9MemObjRelease(pObj);
      pObj->x = aVar4;
      goto LAB_00139804;
    }
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE"
               ,(pCtx->pFunc->sName).zString);
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
LAB_00139804:
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Vfs_chroot(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zPath;
	jx9_vfs *pVfs;
	int rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xChroot == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the desired directory */
	zPath = jx9_value_to_string(apArg[0], 0);
	/* Perform the requested operation */
	rc = pVfs->xChroot(zPath);
	/* IO return value */
	jx9_result_bool(pCtx, rc == JX9_OK);
	return JX9_OK;
}